

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O0

ModuleNamespace * Js::ModuleNamespace::GetModuleNamespace(ModuleRecordBase *requestModule)

{
  code *pcVar1;
  ModuleNamespace *moduleRecord_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  JavascriptLibrary *pJVar6;
  Recycler *pRVar7;
  ScriptContext *this;
  DynamicType *type;
  TrackAllocData local_60;
  Recycler *local_38;
  Recycler *recycler;
  ScriptContext *scriptContext;
  ModuleNamespace *nsObject;
  SourceTextModuleRecord *moduleRecord;
  ModuleRecordBase *requestModule_local;
  
  moduleRecord = (SourceTextModuleRecord *)requestModule;
  uVar3 = (*(requestModule->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xd])();
  if ((uVar3 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ModuleNamespace.cpp"
                                ,0x18,"(requestModule->IsSourceTextModuleRecord())",
                                "requestModule->IsSourceTextModuleRecord()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  nsObject = (ModuleNamespace *)SourceTextModuleRecord::FromHost(moduleRecord);
  iVar4 = (*(((SourceTextModuleRecord *)nsObject)->super_ModuleRecordBase).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6])();
  scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar4);
  requestModule_local = (ModuleRecordBase *)scriptContext;
  if (scriptContext == (ScriptContext *)0x0) {
    pJVar6 = ModuleRecordBase::GetRealm((ModuleRecordBase *)nsObject);
    recycler = (Recycler *)JavascriptLibrary::GetScriptContext(pJVar6);
    pRVar7 = ScriptContext::GetRecycler((ScriptContext *)recycler);
    local_38 = pRVar7;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ModuleNamespace.cpp"
               ,0x22);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_60);
    this = (ScriptContext *)new<Memory::Recycler>(0x48,pRVar7,0x43c4b0);
    moduleRecord_00 = nsObject;
    pJVar6 = ScriptContext::GetLibrary((ScriptContext *)recycler);
    type = JavascriptLibrary::GetModuleNamespaceType(pJVar6);
    ModuleNamespace((ModuleNamespace *)this,(ModuleRecordBase *)moduleRecord_00,type);
    scriptContext = this;
    Initialize((ModuleNamespace *)this);
    (*(nsObject->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(nsObject,scriptContext);
    requestModule_local = (ModuleRecordBase *)scriptContext;
  }
  return (ModuleNamespace *)requestModule_local;
}

Assistant:

ModuleNamespace* ModuleNamespace::GetModuleNamespace(ModuleRecordBase* requestModule)
    {
        Assert(requestModule->IsSourceTextModuleRecord());
        SourceTextModuleRecord* moduleRecord = SourceTextModuleRecord::FromHost(requestModule);
        ModuleNamespace* nsObject = moduleRecord->GetNamespace();
        if (nsObject != nullptr)
        {
            return nsObject;
        }
        ScriptContext* scriptContext = moduleRecord->GetRealm()->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        nsObject = RecyclerNew(recycler, ModuleNamespace, moduleRecord, scriptContext->GetLibrary()->GetModuleNamespaceType());
        nsObject->Initialize();

        moduleRecord->SetNamespace(nsObject);
        return nsObject;
    }